

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_modifiers.cpp
# Opt level: O1

ON_XMLNode * __thiscall ON_MeshModifier::AddChildXML(ON_MeshModifier *this,ON_XMLRootNode *root)

{
  int iVar1;
  ON_XMLNode *pOVar2;
  undefined4 extraout_var;
  ON_XMLNode *src;
  
  pOVar2 = (ON_XMLNode *)operator_new(0xe8);
  ON_XMLNode::ON_XMLNode(pOVar2,L"");
  iVar1 = (*(root->super_ON_XMLNode)._vptr_ON_XMLNode[0xb])(root,pOVar2);
  pOVar2 = (ON_XMLNode *)CONCAT44(extraout_var,iVar1);
  if (pOVar2 != (ON_XMLNode *)0x0) {
    src = ON_InternalXMLImpl::Node(&this->m_impl->super_ON_InternalXMLImpl);
    ON_XMLNode::operator=(pOVar2,src);
  }
  return pOVar2;
}

Assistant:

ON_XMLNode* ON_MeshModifier::AddChildXML(ON_XMLRootNode& root) const
{
  ON_XMLNode* mm_node = root.AttachChildNode(new ON_XMLNode(L""));
  if (nullptr != mm_node)
  {
    *mm_node = m_impl->Node();
  }

  return mm_node;
}